

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickManager.cpp
# Opt level: O1

void __thiscall sf::priv::JoystickManager::~JoystickManager(JoystickManager *this)

{
  pointer puVar1;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *paVar2;
  int in_ESI;
  JoystickImpl *this_00;
  long lVar3;
  
  lVar3 = 0;
  this_00 = (JoystickImpl *)this;
  do {
    if (*(char *)((long)this->m_joysticks[0].state.axes + lVar3 + -4) == '\x01') {
      this_00 = (JoystickImpl *)(this->m_joysticks[0].joystick.m_mapping + lVar3 + -4);
      JoystickImpl::close(this_00,in_ESI);
    }
    lVar3 = lVar3 + 0x128;
  } while (lVar3 != 0x940);
  JoystickImpl::cleanup((EVP_PKEY_CTX *)this_00);
  paVar2 = &this->m_joysticks[7].identification.name.m_string.field_2;
  lVar3 = -0x940;
  do {
    puVar1 = (((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                *)(paVar2 + -1))->_M_dataplus)._M_p;
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                   *)puVar1) {
      operator_delete(puVar1);
    }
    if ((void *)((long)paVar2 + -0x78) != *(void **)((long)paVar2 + -0x88)) {
      operator_delete(*(void **)((long)paVar2 + -0x88));
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
              *)((long)paVar2 + -0x128);
    lVar3 = lVar3 + 0x128;
  } while (lVar3 != 0);
  return;
}

Assistant:

JoystickManager::~JoystickManager()
{
    for (int i = 0; i < Joystick::Count; ++i)
    {
        if (m_joysticks[i].state.connected)
            m_joysticks[i].joystick.close();
    }

    JoystickImpl::cleanup();
}